

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# kliveness.c
# Opt level: O3

void deallocateMasterBarrierDisjunctInt(Vec_Ptr_t *vMasterBarrierDisjunctsArg)

{
  void *__ptr;
  void *__ptr_00;
  long lVar1;
  
  if (vMasterBarrierDisjunctsArg != (Vec_Ptr_t *)0x0) {
    if (0 < vMasterBarrierDisjunctsArg->nSize) {
      lVar1 = 0;
      do {
        __ptr = vMasterBarrierDisjunctsArg->pArray[lVar1];
        __ptr_00 = *(void **)((long)__ptr + 8);
        if (__ptr_00 != (void *)0x0) {
          free(__ptr_00);
        }
        free(__ptr);
        lVar1 = lVar1 + 1;
      } while (lVar1 < vMasterBarrierDisjunctsArg->nSize);
    }
    if (vMasterBarrierDisjunctsArg->pArray != (void **)0x0) {
      free(vMasterBarrierDisjunctsArg->pArray);
    }
    free(vMasterBarrierDisjunctsArg);
    return;
  }
  return;
}

Assistant:

void deallocateMasterBarrierDisjunctInt(Vec_Ptr_t *vMasterBarrierDisjunctsArg)
{
	Vec_Int_t *vInt;
	int i;

	if(vMasterBarrierDisjunctsArg)
	{
		Vec_PtrForEachEntry(Vec_Int_t *, vMasterBarrierDisjunctsArg, vInt, i)
		{	
			Vec_IntFree(vInt);
		}
		Vec_PtrFree(vMasterBarrierDisjunctsArg);
	}
}